

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::NewKey
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key)

{
  Node *pNVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  
  while (uVar7 = this->Size - 1 & key, pNVar1 = this->Nodes + uVar7,
        this->Nodes[uVar7].Next != (Node *)0x1) {
    pNVar6 = GetFreePos(this);
    if (pNVar6 != (Node *)0x0) {
      pNVar9 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key) != pNVar1) goto LAB_00459821;
      pNVar6->Next = pNVar1->Next;
      pNVar9 = pNVar6;
      goto LAB_0045984c;
    }
    Rehash(this);
  }
LAB_00459847:
  pNVar6 = (Node *)0x0;
  pNVar9 = pNVar1;
LAB_0045984c:
  pNVar1->Next = pNVar6;
  this->NumUsed = this->NumUsed + 1;
  (pNVar9->Pair).Key = key;
  return pNVar9;
LAB_00459821:
  do {
    pNVar8 = pNVar9;
    pNVar9 = pNVar8->Next;
  } while (pNVar9 != pNVar1);
  pNVar8->Next = pNVar6;
  uVar3 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x14;
  (pNVar6->Pair).Value.linenum = (pNVar1->Pair).Value.linenum;
  *(undefined4 *)&(pNVar6->Pair).Value.field_0x14 = uVar3;
  pNVar9 = pNVar1->Next;
  iVar4 = (pNVar1->Pair).Key;
  uVar5 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
  uVar3 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x4;
  pcVar2 = (pNVar1->Pair).Value.filename.Chars;
  (pNVar6->Pair).Value.classname = (FName)(pNVar1->Pair).Value.classname.Index;
  *(undefined4 *)&(pNVar6->Pair).Value.field_0x4 = uVar3;
  (pNVar6->Pair).Value.filename.Chars = pcVar2;
  pNVar6->Next = pNVar9;
  (pNVar6->Pair).Key = iVar4;
  *(undefined4 *)&(pNVar6->Pair).field_0x4 = uVar5;
  goto LAB_00459847;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}